

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTest.cpp
# Opt level: O2

void __thiscall FileTest::Test5(FileTest *this)

{
  uint uVar1;
  char buffer [12];
  File *pipe_files [2];
  Selector s;
  
  Selector::Selector(&s,(char *)0x0);
  builtin_strncpy(buffer,"Hello World",0xc);
  JetHead::File::pipe(pipe_files);
  JetHead::File::setSelector((FileListener *)pipe_files[0],(Selector *)&this->super_FileListener);
  uVar1 = (**(code **)(*(long *)pipe_files[1] + 0x18))(pipe_files[1],buffer,0xb);
  if (uVar1 != 0xb) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/FileTest.cpp"
               ,0x1fe,"Failed to write pipe %d",(ulong)uVar1);
  }
  Selector::~Selector(&s);
  return;
}

Assistant:

void FileTest::Test5()
{
	File *pipe_files[ 2 ];
	Selector s;
	const char buffer[] = "Hello World";
	
	File::pipe( pipe_files );
	
	pipe_files[ File::PIPE_READER ]->setSelector( (FileListener*)this, &s );

	int length = strlen( buffer );
	
	int res = pipe_files[ File::PIPE_WRITER ]->write( buffer, length );
	
	if ( res != length )
		TestFailed( "Failed to write pipe %d", res );
	
}